

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

_Bool mi_option_is_enabled(mi_option_t option)

{
  long lVar1;
  mi_option_t in_EDI;
  
  lVar1 = mi_option_get(in_EDI);
  return lVar1 != 0;
}

Assistant:

mi_decl_nodiscard bool mi_option_is_enabled(mi_option_t option) {
  return (mi_option_get(option) != 0);
}